

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hpdf_encoder.c
# Opt level: O0

HPDF_STATUS AddCidRainge(HPDF_MMgr mmgr,HPDF_CidRange_Rec range,HPDF_List target)

{
  HPDF_UINT16 *item;
  HPDF_STATUS ret;
  HPDF_CidRange_Rec *prange;
  HPDF_List target_local;
  HPDF_MMgr mmgr_local;
  HPDF_STATUS HStack_10;
  HPDF_CidRange_Rec range_local;
  
  item = (HPDF_UINT16 *)HPDF_GetMem(mmgr,6);
  if (item == (HPDF_UINT16 *)0x0) {
    HStack_10 = mmgr->error->error_no;
  }
  else {
    mmgr_local._2_2_ = range.from;
    *item = mmgr_local._2_2_;
    mmgr_local._4_2_ = range.to;
    item[1] = mmgr_local._4_2_;
    item[2] = range.cid;
    HStack_10 = HPDF_List_Add(target,item);
    if (HStack_10 == 0) {
      HStack_10 = 0;
    }
    else {
      HPDF_FreeMem(mmgr,item);
    }
  }
  return HStack_10;
}

Assistant:

static HPDF_STATUS
AddCidRainge  (HPDF_MMgr            mmgr,
               HPDF_CidRange_Rec    range,
               HPDF_List            target)
{
    HPDF_CidRange_Rec *prange;
    HPDF_STATUS ret;

    prange = HPDF_GetMem (mmgr, sizeof(HPDF_CidRange_Rec));
    if (!prange)
        return mmgr->error->error_no;

    prange->from = range.from;
    prange->to = range.to;
    prange->cid = range.cid;

    if ((ret = HPDF_List_Add (target, prange))
                != HPDF_OK) {
        HPDF_FreeMem (mmgr, prange);
        return ret;
    }

    return HPDF_OK;
}